

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_vector_column.h
# Opt level: O1

bool Gudhi::persistence_matrix::operator<
               (Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_8UL,_void,_void>_>
                *c1,Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_8UL,_void,_void>_>
                    *c2)

{
  uint uVar1;
  uint uVar2;
  stored_size_type sVar3;
  pointer ppEVar4;
  stored_size_type sVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long *plVar9;
  pointer ppEVar10;
  bool bVar11;
  
  if (c1 == c2) {
    bVar11 = false;
  }
  else {
    sVar3 = (c1->column_).
            super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_void,_void>
            .super_type.m_holder.m_size;
    ppEVar4 = (c2->column_).
              super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_void,_void>
              .super_type.m_holder.m_start;
    sVar5 = (c2->column_).
            super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_void,_void>
            .super_type.m_holder.m_size;
    ppEVar10 = ppEVar4;
    if (sVar5 != 0 && sVar3 != 0) {
      lVar8 = 0;
      do {
        plVar9 = (long *)((long)(c1->column_).
                                super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_void,_void>
                                .super_type.m_holder.m_start + lVar8);
        if ((plVar9 == (long *)0x0) || ((long *)((long)ppEVar4 + lVar8) == (long *)0x0)) {
          __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x8e,
                        "reference boost::container::vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, true, true, false>>> **, true>::operator*() const [Pointer = Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, true, true, false>>> **, IsConst = true]"
                       );
        }
        lVar6 = *plVar9;
        lVar7 = *(long *)((long)ppEVar4 + lVar8);
        uVar1 = *(uint *)(lVar7 + 8);
        uVar2 = *(uint *)(lVar6 + 8);
        if (uVar2 != uVar1) {
          return uVar2 < uVar1;
        }
        uVar1 = *(uint *)(lVar7 + 4);
        uVar2 = *(uint *)(lVar6 + 4);
        if (uVar2 != uVar1) {
          return uVar2 < uVar1;
        }
        lVar6 = lVar8 + 8;
      } while ((sVar3 * 8 + -8 != lVar8) &&
              (bVar11 = sVar5 * 8 + -8 != lVar8, lVar8 = lVar6, bVar11));
      ppEVar10 = (pointer)(lVar6 + (long)ppEVar4);
    }
    bVar11 = ppEVar10 !=
             ppEVar4 + (c2->column_).
                       super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_void,_void>
                       .super_type.m_holder.m_size;
  }
  return bVar11;
}

Assistant:

bool operator<(const Naive_vector_column& c1, const Naive_vector_column& c2) {
    if (&c1 == &c2) return false;

    auto it1 = c1.column_.begin();
    auto it2 = c2.column_.begin();
    while (it1 != c1.column_.end() && it2 != c2.column_.end()) {
      if ((*it1)->get_row_index() != (*it2)->get_row_index()) return (*it1)->get_row_index() < (*it2)->get_row_index();
      if constexpr (!Master_matrix::Option_list::is_z2) {
        if ((*it1)->get_element() != (*it2)->get_element()) return (*it1)->get_element() < (*it2)->get_element();
      }
      ++it1;
      ++it2;
    }
    return it2 != c2.column_.end();
  }